

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML256TableTranscoder.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XML256TableTranscoder::transcodeFrom
          (XML256TableTranscoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  byte bVar1;
  XMLByte *pXVar2;
  size_t local_70;
  XMLCh *pXStack_58;
  XMLCh uniCh;
  XMLCh *outPtr;
  XMLByte *endPtr;
  XMLByte *srcPtr;
  XMLSize_t countToDo;
  XMLSize_t *bytesEaten_local;
  XMLSize_t maxChars_local;
  XMLCh *toFill_local;
  XMLSize_t srcCount_local;
  XMLByte *srcData_local;
  XML256TableTranscoder *this_local;
  
  local_70 = maxChars;
  if (srcCount < maxChars) {
    local_70 = srcCount;
  }
  pXStack_58 = toFill;
  endPtr = srcData;
  while (endPtr < srcData + local_70) {
    pXVar2 = endPtr + 1;
    bVar1 = *endPtr;
    endPtr = pXVar2;
    if (this->fFromTable[bVar1] != L'\xffff') {
      *pXStack_58 = this->fFromTable[bVar1];
      pXStack_58 = pXStack_58 + 1;
    }
  }
  *bytesEaten = local_70;
  memset(charSizes,1,local_70);
  return local_70;
}

Assistant:

XMLSize_t
XML256TableTranscoder::transcodeFrom(const  XMLByte* const       srcData
                                    , const XMLSize_t            srcCount
                                    ,       XMLCh* const         toFill
                                    , const XMLSize_t            maxChars
                                    ,       XMLSize_t&           bytesEaten
                                    ,       unsigned char* const charSizes)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max output chars and the number of chars in the source.
    //
    const XMLSize_t countToDo = srcCount < maxChars ? srcCount : maxChars;

    //
    //  Loop through the count we have to do and map each char via the
    //  lookup table.
    //
    const XMLByte*  srcPtr = srcData;
    const XMLByte*  endPtr = (srcPtr + countToDo);
    XMLCh*          outPtr = toFill;
    while (srcPtr < endPtr)
    {
        const XMLCh uniCh = fFromTable[*srcPtr++];
        if (uniCh != 0xFFFF)
        {
            *outPtr++ = uniCh;
            continue;
        }
    }


    // Set the bytes eaten
    bytesEaten = countToDo;

    // Set the character sizes to the fixed size
    memset(charSizes, 1, countToDo);

    // Return the chars we transcoded
    return countToDo;
}